

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void Js::DynamicProfileInfo::Save(ScriptContext *scriptContext)

{
  int iVar1;
  JavascriptLibrary *pJVar2;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  SimpleDictionaryEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_> *pSVar4;
  WriteBarrierPtr<SourceContextInfo> WVar5;
  Type this;
  char16 *url;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_00;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  ulong uVar9;
  int iVar10;
  
  if (DynamicProfileStorage::enabled) {
    pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if ((pJVar2->cache).sourceContextInfoMap.ptr ==
        (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      this_00 = (pJVar2->cache).profileInfoList.ptr;
      if (this_00 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
        bVar7 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Empty(this_00);
        if ((!bVar7) &&
           (((((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).
             noContextSourceContextInfo.ptr)->nextLocalFunctionId == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                      ,0x5d6,
                                      "(!scriptContext->GetProfileInfoList() || scriptContext->GetProfileInfoList()->Empty() || scriptContext->GetNoContextSourceContextInfo()->nextLocalFunctionId != 0)"
                                      ,
                                      "!scriptContext->GetProfileInfoList() || scriptContext->GetProfileInfoList()->Empty() || scriptContext->GetNoContextSourceContextInfo()->nextLocalFunctionId != 0"
                                     );
          if (!bVar7) {
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar8 = 0;
        }
      }
    }
    else {
      UpdateSourceDynamicProfileManagers(scriptContext);
      pBVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).
               sourceContextInfoMap.ptr;
      for (uVar9 = 0; uVar9 < pBVar3->bucketCount; uVar9 = uVar9 + 1) {
        iVar10 = (pBVar3->buckets).ptr[uVar9];
        if (iVar10 != -1) {
          while (iVar10 != -1) {
            pSVar4 = (pBVar3->entries).ptr;
            iVar1 = pSVar4[iVar10].
                    super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                    .
                    super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                    .
                    super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                    .next;
            WVar5.ptr = pSVar4[iVar10].
                        super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                        .
                        super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                        .value.ptr;
            this.ptr = ((WVar5.ptr)->sourceDynamicProfileManager).ptr;
            iVar10 = iVar1;
            if ((((this.ptr != (SourceDynamicProfileManager *)0x0) &&
                 (url = ((WVar5.ptr)->field_5).field_0.url, url != (char16 *)0x0)) &&
                ((WVar5.ptr)->dwHostSourceContext != 0xffffffffffffffff)) &&
               (((WVar5.ptr)->isHostDynamicDocument & 1U) == 0)) {
              SourceDynamicProfileManager::SaveToDynamicProfileStorage(this.ptr,url);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::Save(ScriptContext * scriptContext)
    {
        // For now, we only support our local storage
#ifdef DYNAMIC_PROFILE_STORAGE
        if (!DynamicProfileStorage::IsEnabled())
        {
            return;
        }

        if (scriptContext->GetSourceContextInfoMap() == nullptr)
        {
            // We don't have savable code
            Assert(!scriptContext->GetProfileInfoList() || scriptContext->GetProfileInfoList()->Empty() || scriptContext->GetNoContextSourceContextInfo()->nextLocalFunctionId != 0);
            return;
        }
        DynamicProfileInfo::UpdateSourceDynamicProfileManagers(scriptContext);

        scriptContext->GetSourceContextInfoMap()->Map([&](DWORD_PTR dwHostSourceContext, SourceContextInfo * sourceContextInfo)
        {
            if (sourceContextInfo->sourceDynamicProfileManager != nullptr && sourceContextInfo->url != nullptr
                && !sourceContextInfo->IsDynamic())
            {
                sourceContextInfo->sourceDynamicProfileManager->SaveToDynamicProfileStorage(sourceContextInfo->url);
            }
        });
#endif
    }